

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod_inv.c
# Opt level: O3

int32 mod_inv_read_mixw(model_inventory_t *minv,model_def_t *mdef,char *fn,float32 floor)

{
  uint32 uVar1;
  bool bVar2;
  int iVar3;
  void *ptr;
  uint32 *err_norm;
  ulong uVar4;
  ulong uVar5;
  int32 iVar6;
  ulong uVar7;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mixw;
  float32 ***mixw;
  undefined8 in_stack_ffffffffffffffa8;
  char *pcVar8;
  undefined4 uVar9;
  uint local_48;
  uint32 local_44;
  uint local_40;
  float32 local_3c;
  float32 ***local_38;
  
  uVar9 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_3c = floor;
  iVar3 = s3mixw_read(fn,&local_38,&local_40,&local_44,&local_48);
  iVar6 = -1;
  if (iVar3 == 0) {
    minv->mixw = local_38;
    minv->n_mixw = local_40;
    if (local_40 != mdef->n_tied_state) {
      pcVar8 = fn;
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x161,
              "Number of tied states in mdef file %u differs from the number of mixtures %u in %s, do files belong to the same model?\n"
              ,(ulong)mdef->n_tied_state,(ulong)local_40,fn);
      uVar9 = (undefined4)((ulong)pcVar8 >> 0x20);
    }
    if (minv->n_feat == 0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x16a,
              "Number of feature streams in the model inventory is not set; setting to the value in mixture_weights file, %u.\n"
             );
      minv->n_feat = local_44;
    }
    else if (local_44 != minv->n_feat) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x166,
              "Number of feature streams in mixture_weights file %u differs from the configured value %u, check the command line options\n"
             );
      exit(1);
    }
    uVar1 = minv->n_density;
    if (uVar1 == 0) {
      minv->n_density = local_48;
    }
    else if (local_48 != uVar1) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x171,
              "Number of densities per mixture, %u in %s differs from the configured value %u\n, check the command line options"
              ,(ulong)local_48,fn,CONCAT44(uVar9,uVar1));
    }
    iVar6 = 0;
    if ((((float)local_3c != 0.0) || (NAN((float)local_3c))) && (local_40 != 0)) {
      uVar7 = 0;
      uVar4 = 0;
      ptr = (void *)0x0;
      do {
        if (local_44 != 0) {
          uVar5 = 0;
          bVar2 = false;
          do {
            iVar6 = vector_normalize((vector_t)local_38[uVar7][uVar5],local_48);
            if (iVar6 != 0) {
              bVar2 = true;
            }
            vector_floor((vector_t)local_38[uVar7][uVar5],local_48,local_3c);
            vector_normalize((vector_t)local_38[uVar7][uVar5],local_48);
            uVar5 = uVar5 + 1;
          } while (uVar5 < local_44);
          if (bVar2) {
            if (ptr == (void *)0x0) {
              ptr = __ckd_calloc__((ulong)local_40,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
                                   ,399);
            }
            *(int *)((long)ptr + uVar4 * 4) = (int)uVar7;
            uVar4 = (ulong)((int)uVar4 + 1);
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_40);
      if ((int)uVar4 == 0) {
        iVar6 = 0;
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
                ,0x198,"Failed to norm for %d mixw:",uVar4);
        uVar7 = 0;
        do {
          err_msg(ERR_INFOCONT,(char *)0x0,0," %u",(ulong)*(uint *)((long)ptr + uVar7 * 4));
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
        iVar6 = 0;
        err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
        ckd_free(ptr);
      }
    }
  }
  return iVar6;
}

Assistant:

int32
mod_inv_read_mixw(model_inventory_t *minv,
		  const model_def_t *mdef,
		  const char *fn,
		  float32 floor)
{
    float32 ***mixw;
    uint32 n_mixw, i;
    uint32 n_feat, j;
    uint32 n_density;

    if (s3mixw_read(fn,
		    &mixw,
		    &n_mixw,
		    &n_feat,
		    &n_density) != S3_SUCCESS) {
	return S3_ERROR;
    }
    minv->mixw = mixw;
    minv->n_mixw = n_mixw;

    if (n_mixw != mdef->n_tied_state) {
	E_WARN("Number of tied states in mdef file %u differs from the number of mixtures %u in %s, do files belong to the same model?\n",
	       mdef->n_tied_state, n_mixw, fn);
    }

    if ((minv->n_feat > 0) && (n_feat != minv->n_feat)) {
	E_FATAL("Number of feature streams in mixture_weights file %u differs from the configured value %u, check the command line options\n",
		n_feat, minv->n_feat);
    }
    else if (minv->n_feat == 0) {
	E_WARN("Number of feature streams in the model inventory is not set; setting to the value in mixture_weights file, %u.\n",
	       n_feat);

	minv->n_feat = n_feat;
    }

    if ((minv->n_density > 0) && (n_density != minv->n_density)) {
	E_WARN("Number of densities per mixture, %u in %s differs from the configured value %u\n, check the command line options",
	       n_density, fn, minv->n_density);
    }
    else if (minv->n_density == 0) {
	/* This warning is bogus. */
        /* E_WARN("Model inventory n_density not set; setting to value in mixw file, %u.\n",
	   n_density); */

	minv->n_density = n_density;
    }

    if (floor != 0) {
	uint32 *err_norm = NULL;
	uint32 n_err_norm = 0;
	uint32 err = FALSE;

	for (i = 0; i < n_mixw; i++) {
	    for (j = 0; j < n_feat; j++) {
		if (vector_normalize(mixw[i][j], n_density) != S3_SUCCESS) {
		    err = TRUE;
		}
		vector_floor(mixw[i][j], n_density, floor);
		vector_normalize(mixw[i][j], n_density);
	    }

	    if (err) {
		if (err_norm) {
		    err_norm[n_err_norm++] = i;
		}
		else {
		    /* first use; allocate it */
		    err_norm = ckd_calloc(n_mixw, sizeof(uint32));
		    err_norm[n_err_norm++] = i;
		}

		err = FALSE;
	    }
	}

	if (n_err_norm > 0) {
	    E_INFO("Failed to norm for %d mixw:", n_err_norm);
	    for (i = 0; i < n_err_norm; i++) {
		E_INFOCONT(" %u", err_norm[i]);
	    }
	    E_INFOCONT("\n");

	    ckd_free(err_norm);
	}
    }

    return S3_SUCCESS;
}